

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

void LinkLibraryTypeSpecifierWarning(cmMakefile *mf,int left,int right)

{
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  int local_18;
  int local_14;
  int right_local;
  int left_local;
  cmMakefile *mf_local;
  
  local_18 = right;
  local_14 = left;
  _right_local = mf;
  cmAlphaNum::cmAlphaNum(&local_68,"Link library type specifier \"");
  cmAlphaNum::cmAlphaNum
            (&local_98,*(char **)((anonymous_namespace)::LinkLibraryTypeNames + (long)local_14 * 8))
  ;
  cmStrCat<char[29],char_const*,char[67]>
            (&local_38,&local_68,&local_98,(char (*) [29])"\" is followed by specifier \"",
             (char **)((anonymous_namespace)::LinkLibraryTypeNames + (long)local_18 * 8),
             (char (*) [67])"\" instead of a library name.  The first specifier will be ignored.");
  cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void LinkLibraryTypeSpecifierWarning(cmMakefile& mf, int left,
                                            int right)
{
  mf.IssueMessage(
    MessageType::AUTHOR_WARNING,
    cmStrCat(
      "Link library type specifier \"", LinkLibraryTypeNames[left],
      "\" is followed by specifier \"", LinkLibraryTypeNames[right],
      "\" instead of a library name.  The first specifier will be ignored."));
}